

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *this,Monom *m)

{
  ulong uVar1;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *r;
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> cont;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> local_58;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_38;
  
  IntegerConstantType::IntegerConstantType(&local_38.numeral,&m->numeral);
  local_38.factors._id = (m->factors)._id;
  local_38.factors._ptr = (m->factors)._ptr;
  cont._M_len = 1;
  cont._M_array = &local_38;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::Stack(&local_58,cont)
  ;
  Polynom(this,&local_58);
  r = local_58._cursor;
  while (r != local_58._stack) {
    r = r + -1;
    mpz_clear((__mpz_struct *)r);
  }
  if (r != (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
    uVar1 = local_58._capacity << 5;
    if (uVar1 == 0) {
      ((local_58._stack)->numeral)._val[0]._mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
      ((local_58._stack)->numeral)._val[0]._mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._stack;
    }
    else if (uVar1 < 0x21) {
      ((local_58._stack)->numeral)._val[0]._mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
      ((local_58._stack)->numeral)._val[0]._mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_58._stack;
    }
    else if (uVar1 < 0x31) {
      ((local_58._stack)->numeral)._val[0]._mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
      ((local_58._stack)->numeral)._val[0]._mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_58._stack;
    }
    else if (uVar1 < 0x41) {
      ((local_58._stack)->numeral)._val[0]._mp_alloc = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
      ((local_58._stack)->numeral)._val[0]._mp_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_58._stack;
    }
    else {
      operator_delete(local_58._stack,0x10);
    }
  }
  mpz_clear((__mpz_struct *)&local_38);
  return;
}

Assistant:

Polynom<Number>::Polynom(Monom m) 
  : Polynom(
      Stack<Monom>{m})
{  }